

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O0

void __thiscall echo_server::handle_error(echo_server *this,tcp_connection *conn)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  endpoint local_28 [8];
  endpoint ep;
  tcp_connection *conn_local;
  echo_server *this_local;
  
  _local_28 = ranger::event::tcp_connection::remote_endpoint();
  poVar2 = std::operator<<((ostream *)&std::cerr,"connection[");
  poVar2 = ranger::event::operator<<(poVar2,local_28);
  poVar2 = std::operator<<(poVar2,"] ");
  poVar2 = std::operator<<(poVar2,"error[");
  iVar1 = ranger::event::tcp_connection::error_code();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"]: ");
  pcVar3 = (char *)ranger::event::tcp_connection::error_description();
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::
  set<ranger::event::tcp_connection,_std::less<ranger::event::tcp_connection>,_std::allocator<ranger::event::tcp_connection>_>
  ::erase(&this->m_conn_set,conn);
  return;
}

Assistant:

void handle_error(ranger::event::tcp_connection& conn) {
		auto ep = conn.remote_endpoint();
		std::cerr << "connection[" << ep << "] " << "error[" << conn.error_code() << "]: " << conn.error_description() << std::endl;

		m_conn_set.erase(conn);
	}